

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_complex_div(sexp ctx,sexp a,sexp b)

{
  sexp real_00;
  sexp psVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp denom;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp imag;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp real;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp_conflict *local_78;
  sexp image;
  sexp local_50;
  undefined1 local_48 [24];
  sexp_gc_var_t local_30;
  undefined8 local_20;
  
  local_20 = &DAT_0000043e;
  memset(&local_30,0,0x10);
  local_48._16_8_ = 0x43e;
  memset(local_48,0,0x10);
  local_50 = (sexp)0x43e;
  memset(&stack0xffffffffffffffa0,0,0x10);
  memset(&local_78,0,0x10);
  local_30.var = (sexp_conflict *)&stack0xffffffffffffffe0;
  local_30.next = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = &local_30;
  local_48._0_8_ = local_48 + 0x10;
  local_48._8_8_ = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)local_48;
  psVar1 = (sexp)&local_50;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa0;
  local_78 = (sexp_conflict *)&stack0xffffffffffffff98;
  image = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&local_78;
  sexp_mul((sexp)__sexp_gc_preserver3.next,(sexp)__sexp_gc_preserver3.var,denom);
  local_20 = sexp_mul((sexp)__sexp_gc_preserver3.next,(sexp)__sexp_gc_preserver3.var,denom);
  real_00 = sexp_add(denom,(sexp)__sexp_gc_preserver4.next,(sexp)__sexp_gc_preserver4.var);
  local_48._16_8_ = sexp_mul((sexp)__sexp_gc_preserver3.next,(sexp)__sexp_gc_preserver3.var,denom);
  local_20 = sexp_mul((sexp)__sexp_gc_preserver3.next,(sexp)__sexp_gc_preserver3.var,denom);
  local_48._16_8_ = sexp_add(denom,(sexp)__sexp_gc_preserver4.next,(sexp)__sexp_gc_preserver4.var);
  local_48._16_8_ = sexp_div((sexp)__sexp_gc_preserver4.var,(sexp)in_RDI,(sexp)in_RSI);
  local_50 = sexp_mul((sexp)__sexp_gc_preserver3.next,(sexp)__sexp_gc_preserver3.var,denom);
  local_20 = sexp_mul((sexp)__sexp_gc_preserver3.next,(sexp)__sexp_gc_preserver3.var,denom);
  local_50 = sexp_sub((sexp)__sexp_gc_preserver2.var,imag,(sexp)__sexp_gc_preserver3.next);
  local_50 = sexp_div((sexp)__sexp_gc_preserver4.var,(sexp)in_RDI,(sexp)in_RSI);
  local_20 = sexp_make_complex(psVar1,real_00,image);
  (((sexp)in_RDI)->value).context.saves = local_30.next;
  psVar1 = sexp_complex_normalize((sexp)local_20);
  return psVar1;
}

Assistant:

sexp sexp_complex_div (sexp ctx, sexp a, sexp b) {
  sexp_gc_var4(res, real, imag, denom);
  sexp_gc_preserve4(ctx, res, real, imag, denom);
  /* c^2 + d^2 */
  denom = sexp_mul(ctx, sexp_complex_real(b), sexp_complex_real(b));
  res = sexp_mul(ctx, sexp_complex_imag(b), sexp_complex_imag(b));
  denom = sexp_add(ctx, denom, res);
  /* ac + bd */
  real = sexp_mul(ctx, sexp_complex_real(a), sexp_complex_real(b));
  res = sexp_mul(ctx, sexp_complex_imag(a), sexp_complex_imag(b));
  real = sexp_add(ctx, real, res);
  real = sexp_div(ctx, real, denom);
  /* bc - ad */
  imag = sexp_mul(ctx, sexp_complex_imag(a), sexp_complex_real(b));
  res = sexp_mul(ctx, sexp_complex_real(a), sexp_complex_imag(b));
  imag = sexp_sub(ctx, imag, res);
  imag = sexp_div(ctx, imag, denom);
  res = sexp_make_complex(ctx, real, imag);
  sexp_gc_release4(ctx);
  return sexp_complex_normalize(res);
}